

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

void __thiscall
FOptionMenuItemStaticTextSwitchable::FOptionMenuItemStaticTextSwitchable
          (FOptionMenuItemStaticTextSwitchable *this,char *label,char *label2,FName *action,
          EColorRange cr)

{
  FName local_24;
  
  FOptionMenuItem::FOptionMenuItem(&this->super_FOptionMenuItem,label,&local_24,true);
  (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuItemStaticTextSwitchable_006f2020;
  (this->mAltText).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  *(EColorRange *)&(this->super_FOptionMenuItem).field_0x24 = cr;
  FString::operator=(&this->mAltText,label2);
  this->mCurrent = 0;
  return;
}

Assistant:

FOptionMenuItemStaticTextSwitchable(const char *label, const char *label2, FName action, EColorRange cr)
		: FOptionMenuItem(label, action, true)
	{
		mColor = cr;
		mAltText = label2;
		mCurrent = 0;
	}